

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

PClassAmmo * T_GetAmmo(svalue_t *t)

{
  uint uVar1;
  PClassActor *p_00;
  PClassAmmo *am;
  char *pcStack_20;
  int ammonum;
  char *p;
  svalue_t *t_local;
  
  if (t->type == 0) {
    pcStack_20 = stringvalue(t);
  }
  else {
    uVar1 = intvalue(t);
    if (((int)uVar1 < 0) || (3 < (int)uVar1)) {
      script_error("ammo number out of range: %i",(ulong)uVar1);
      return (PClassAmmo *)0x0;
    }
    pcStack_20 = T_GetAmmo::DefAmmo[(int)uVar1];
  }
  p_00 = PClass::FindActor(pcStack_20);
  t_local = (svalue_t *)dyn_cast<PClassAmmo>((DObject *)p_00);
  if ((PClassAmmo *)t_local == (PClassAmmo *)0x0) {
    script_error("unknown ammo type : %s",pcStack_20);
    t_local = (svalue_t *)0x0;
  }
  return (PClassAmmo *)t_local;
}

Assistant:

static PClassAmmo * T_GetAmmo(const svalue_t &t)
{
	const char * p;

	if (t.type==svt_string)
	{
		p=stringvalue(t);
	}
	else	
	{
		// backwards compatibility with Legacy.
		// allow only Doom's standard types here!
		static const char * DefAmmo[]={"Clip","Shell","Cell","RocketAmmo"};
		int ammonum = intvalue(t);
		if(ammonum < 0 || ammonum >= 4)	
		{
			script_error("ammo number out of range: %i", ammonum);
			return NULL;
		}
		p=DefAmmo[ammonum];
	}
	PClassAmmo * am=dyn_cast<PClassAmmo>(PClass::FindActor(p));
	if (am == NULL)
	{
		script_error("unknown ammo type : %s", p);
		return NULL;
	}
	return am;

}